

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_ldpc_file_formats.hpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
LDPC4QKD::HelpersReadFilesLDPC::helper_parse_space_sep_ints<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,string *in)

{
  pointer pcVar1;
  iterator iVar2;
  pointer puVar3;
  long lVar4;
  _Alloc_hider _Var5;
  int iVar6;
  uint uVar7;
  size_type sVar8;
  ulong uVar9;
  void *pvVar10;
  int *piVar11;
  longlong lVar12;
  undefined8 uVar13;
  size_t __n;
  ulong uVar14;
  uint local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *local_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_not_of(in," \t\n\r\f\v",0xffffffffffffffff,6);
  uVar9 = sVar8 + 1;
  if (uVar9 <= in->_M_string_length) {
    in->_M_string_length = uVar9;
    (in->_M_dataplus)._M_p[uVar9] = '\0';
    sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_not_of(in," \t\n\r\f\v",0,6);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (in,0,sVar8);
    uVar9 = 0;
LAB_0010af8f:
    uVar14 = 0xffffffffffffffff;
    __n = in->_M_string_length - uVar9;
    if (uVar9 <= in->_M_string_length && __n != 0) {
      pcVar1 = (in->_M_dataplus)._M_p;
      pvVar10 = memchr(pcVar1 + uVar9,0x20,__n);
      uVar14 = -(ulong)(pvVar10 == (void *)0x0) | (long)pvVar10 - (long)pcVar1;
    }
    if (uVar14 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_58,in,uVar9,0xffffffffffffffff);
      _Var5._M_p = local_58._M_dataplus._M_p;
      piVar11 = __errno_location();
      iVar6 = *piVar11;
      *piVar11 = 0;
      lVar12 = strtoll(_Var5._M_p,&local_38,10);
      uVar7 = (uint)lVar12;
      if (local_38 == _Var5._M_p) {
        uVar13 = std::__throw_invalid_argument("stoll");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        puVar3 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar3 != (pointer)0x0) {
          operator_delete(puVar3,(long)(__return_storage_ptr__->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)puVar3);
        }
        _Unwind_Resume(uVar13);
      }
      if (*piVar11 != 0) {
        if (*piVar11 != 0x22) goto LAB_0010b0f4;
        uVar7 = std::__throw_out_of_range("stoll");
      }
      *piVar11 = iVar6;
LAB_0010b0f4:
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      local_5c = uVar7;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (__return_storage_ptr__,iVar2,&local_5c);
      }
      else {
        *iVar2._M_current = uVar7;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_58,in,uVar9,uVar14 - uVar9);
    _Var5._M_p = local_58._M_dataplus._M_p;
    piVar11 = __errno_location();
    iVar6 = *piVar11;
    *piVar11 = 0;
    lVar12 = strtoll(_Var5._M_p,&local_38,10);
    if (local_38 != _Var5._M_p) {
      if (*piVar11 == 0) {
        *piVar11 = iVar6;
      }
      else if (*piVar11 == 0x22) goto LAB_0010b155;
      local_5c = (uint)lVar12;
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (__return_storage_ptr__,iVar2,&local_5c);
      }
      else {
        *iVar2._M_current = local_5c;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = (in->_M_dataplus)._M_p;
      do {
        lVar4 = uVar14 + 1;
        uVar14 = uVar14 + 1;
        iVar6 = isspace((int)pcVar1[lVar4]);
        uVar9 = uVar14;
      } while (iVar6 != 0);
      goto LAB_0010af8f;
    }
    std::__throw_invalid_argument("stoll");
LAB_0010b155:
    uVar9 = std::__throw_out_of_range("stoll");
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar9);
}

Assistant:

std::vector <idx_t> helper_parse_space_sep_ints(std::string &in) {
            std::vector <idx_t> ret;

            std::size_t start = 0;
            std::size_t end = 0;
            constexpr auto trimmed_whitespace = " \t\n\r\f\v";
            constexpr auto delimiter = ' ';

            // trim leading and trailing whitespace
            in.erase(in.find_last_not_of(trimmed_whitespace) + 1);
            in.erase(0, in.find_first_not_of(trimmed_whitespace));

            while (std::string::npos != (end = in.find(delimiter, start))) {
                ret.push_back(static_cast<idx_t>(std::stoll(in.substr(start, end - start))));
                start = end + 1;
                while (::isspace(in[start]))
                    ++start;
            }
            ret.push_back(static_cast<idx_t>(std::stoll(in.substr(start))));
            return ret;
        }